

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O2

ChFrame<double> * __thiscall
chrono::ChFrame<double>::operator*
          (ChFrame<double> *__return_storage_ptr__,ChFrame<double> *this,ChFrame<double> *Fb)

{
  ChVector<double> local_58;
  ChQuaternion<double> local_38;
  
  local_58.m_data[2] = 0.0;
  local_38.m_data[0] = 1.0;
  local_38.m_data[3] = 0.0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_38.m_data[1] = 0.0;
  local_38.m_data[2] = 0.0;
  ChFrame(__return_storage_ptr__,&local_58,&local_38);
  TransformLocalToParent(this,Fb,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

ChFrame<Real> operator*(const ChFrame<Real>& Fb) const {
        ChFrame<Real> res;
        TransformLocalToParent(Fb, res);
        return res;
    }